

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O2

void __thiscall UDUNITS_acceptedNameSymbols_Test::TestBody(UDUNITS_acceptedNameSymbols_Test *this)

{
  double dVar1;
  bool bVar2;
  XMLError XVar3;
  XMLElement *pXVar4;
  XMLElement *pXVar5;
  char *pcVar6;
  uint64_t uVar7;
  ulong uVar8;
  ostream *poVar9;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *in_R9;
  int iVar10;
  precise_unit pVar11;
  unit local_3f0;
  int failConvert;
  AssertionResult gtest_ar_;
  string def;
  string local_398;
  string local_378;
  string local_358;
  XMLDocument doc;
  
  tinyxml2::XMLDocument::XMLDocument(&doc,true,PRESERVE_WHITESPACE);
  XVar3 = tinyxml2::XMLDocument::LoadFile
                    (&doc,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-accepted.xml"
                    );
  this_00 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = XVar3 == XML_SUCCESS;
  if (XVar3 == XML_SUCCESS) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&doc.super_XMLNode,"unit-system");
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"unit");
    failConvert = 0;
    iVar10 = 0;
    while (pXVar4 != (XMLElement *)0x0) {
      pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"def");
      pcVar6 = tinyxml2::XMLNode::Value((pXVar5->super_XMLNode)._firstChild);
      std::__cxx11::string::string((string *)&def,pcVar6,(allocator *)&gtest_ar_);
      std::__cxx11::string::string((string *)&local_378,(string *)&def);
      uVar7 = units::getDefaultFlags();
      pVar11 = units::unit_from_string(&local_378,uVar7);
      uVar8 = pVar11._8_8_;
      dVar1 = pVar11.multiplier_;
      std::__cxx11::string::~string((string *)&local_378);
      if ((uVar8 & 0xffffffff) == 0xfa94a488 || NAN(dVar1)) {
        poVar9 = std::operator<<((ostream *)&std::cout,"unable to convert ");
        poVar9 = std::operator<<(poVar9,(string *)&def);
        std::operator<<(poVar9," into a valid unit \n");
        iVar10 = iVar10 + 1;
        failConvert = iVar10;
      }
      else {
        pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"name");
        if (pXVar5 != (XMLElement *)0x0) {
          pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar5->super_XMLNode,"singular");
          pcVar6 = tinyxml2::XMLNode::Value((pXVar5->super_XMLNode)._firstChild);
          std::__cxx11::string::string((string *)&local_398,pcVar6,(allocator *)&gtest_ar_);
          uVar7 = units::getDefaultFlags();
          pVar11 = units::unit_from_string(&local_398,uVar7);
          std::__cxx11::string::~string((string *)&local_398);
          if ((pVar11._8_8_ & 0xffffffff) == 0xfa94a488 || NAN(pVar11.multiplier_)) {
            poVar9 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar9 = std::operator<<(poVar9,pcVar6);
            std::operator<<(poVar9," into a valid unit \n");
          }
          else {
            gtest_ar_._0_8_ = (ulong)(uint)(float)pVar11.multiplier_ | pVar11._8_8_ << 0x20;
            local_3f0 = (unit)((ulong)(uint)(float)dVar1 | uVar8 << 0x20);
            bVar2 = units::unit::operator!=((unit *)&gtest_ar_,&local_3f0);
            if (!bVar2) goto LAB_0012830f;
            poVar9 = std::operator<<((ostream *)&std::cout,"name and unit do not match ");
            poVar9 = std::operator<<(poVar9,pcVar6);
            poVar9 = std::operator<<(poVar9," and ");
            poVar9 = std::operator<<(poVar9,(string *)&def);
            std::operator<<(poVar9,"\n");
          }
          iVar10 = iVar10 + 1;
          failConvert = iVar10;
        }
LAB_0012830f:
        pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"symbol");
        for (; pXVar5 != (XMLElement *)0x0;
            pXVar5 = tinyxml2::XMLNode::NextSiblingElement(&pXVar5->super_XMLNode,"symbol")) {
          pcVar6 = tinyxml2::XMLNode::Value((pXVar5->super_XMLNode)._firstChild);
          std::__cxx11::string::string((string *)&local_358,pcVar6,(allocator *)&gtest_ar_);
          uVar7 = units::getDefaultFlags();
          pVar11 = units::unit_from_string(&local_358,uVar7);
          std::__cxx11::string::~string((string *)&local_358);
          if ((pVar11._8_8_ & 0xffffffff) == 0xfa94a488 || NAN(pVar11.multiplier_)) {
            poVar9 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar9 = std::operator<<(poVar9,pcVar6);
            std::operator<<(poVar9," into a valid unit \n");
LAB_00128443:
            iVar10 = iVar10 + 1;
            failConvert = iVar10;
          }
          else {
            gtest_ar_._0_8_ = (ulong)(uint)(float)pVar11.multiplier_ | pVar11._8_8_ << 0x20;
            local_3f0 = (unit)((ulong)(uint)(float)dVar1 | uVar8 << 0x20);
            bVar2 = units::unit::operator!=((unit *)&gtest_ar_,&local_3f0);
            if (bVar2) {
              poVar9 = std::operator<<((ostream *)&std::cout,"symbol and unit do not match ");
              poVar9 = std::operator<<(poVar9,pcVar6);
              poVar9 = std::operator<<(poVar9," and ");
              poVar9 = std::operator<<(poVar9,(string *)&def);
              std::operator<<(poVar9,"\n");
              goto LAB_00128443;
            }
          }
        }
      }
      pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"unit");
      std::__cxx11::string::~string((string *)&def);
    }
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&def,"failConvert","0",&failConvert,(int *)&gtest_ar_);
    if ((char)def._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (def._M_string_length == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)def._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x48,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f0);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&def._M_string_length;
  }
  else {
    testing::Message::Message((Message *)&local_3f0);
    std::ostream::operator<<((long *)((long)local_3f0 + 0x10),XVar3);
    std::endl<char,std::char_traits<char>>((ostream *)((long)local_3f0 + 0x10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&def,(internal *)&gtest_ar_,(AssertionResult *)0x169878,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&failConvert,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0x17,(char *)CONCAT71(def._M_dataplus._M_p._1_7_,(char)def._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&failConvert,(Message *)&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&failConvert);
    std::__cxx11::string::~string((string *)&def);
    if (local_3f0 != (unit)0x0) {
      (**(code **)(*(long *)local_3f0 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  tinyxml2::XMLDocument::~XMLDocument(&doc);
  return;
}

Assistant:

TEST(UDUNITS, acceptedNameSymbols)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-accepted.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert = 0;
    while (cs != nullptr) {
        std::string def = cs->FirstChildElement("def")->FirstChild()->Value();

        auto definitionUnit = units::unit_from_string(def);
        if (is_error(definitionUnit)) {
            std::cout << "unable to convert " << def << " into a valid unit \n";
            ++failConvert;
        } else {
            auto name = cs->FirstChildElement("name");
            if (name != nullptr) {
                auto sname =
                    name->FirstChildElement("singular")->FirstChild()->Value();
                auto nameUnit = units::unit_from_string(sname);
                if (is_error(nameUnit)) {
                    std::cout << "unable to convert " << sname
                              << " into a valid unit \n";
                    ++failConvert;
                } else {
                    if (unit_cast(nameUnit) != unit_cast(definitionUnit)) {
                        std::cout << "name and unit do not match " << sname
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            // check for symbols
            auto sym = cs->FirstChildElement("symbol");
            while (sym != nullptr) {
                auto symString = sym->FirstChild()->Value();
                auto symUnit = units::unit_from_string(symString);
                if (is_error(symUnit)) {
                    std::cout << "unable to convert " << symString
                              << " into a valid unit \n";
                    ++failConvert;
                } else {
                    if (unit_cast(symUnit) != unit_cast(definitionUnit)) {
                        std::cout << "symbol and unit do not match "
                                  << symString << " and " << def << "\n";
                        ++failConvert;
                    }
                }
                sym = sym->NextSiblingElement("symbol");
            }
        }
        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}